

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine.cpp
# Opt level: O0

int __thiscall QFSFileEngine::remove(QFSFileEngine *this,char *__filename)

{
  undefined1 uVar1;
  long in_FS_OFFSET;
  bool ret;
  QFSFileEnginePrivate *d;
  QSystemError error;
  QSystemError *in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  FileError error_00;
  undefined7 in_stack_ffffffffffffffc0;
  QSystemError local_10;
  long local_8;
  
  error_00 = (FileError)((ulong)this >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QFSFileEngine *)0x12c80a);
  local_10.errorCode = -0x55555556;
  local_10.errorScope = 0xaaaaaaaa;
  QSystemError::QSystemError(&local_10);
  uVar1 = QFileSystemEngine::removeFile
                    ((QFileSystemEntry *)
                     CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                     in_stack_ffffffffffffffa8);
  if ((bool)uVar1) {
    QFileSystemMetaData::clear
              ((QFileSystemMetaData *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0))
    ;
  }
  else {
    QSystemError::toString(in_stack_ffffffffffffffa8);
    QAbstractFileEngine::setError
              ((QAbstractFileEngine *)CONCAT17(uVar1,in_stack_ffffffffffffffc0),error_00,
               (QString *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
    QString::~QString((QString *)0x12c872);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (uint)CONCAT71((int7)((ulong)*(long *)(in_FS_OFFSET + 0x28) >> 8),uVar1) & 0xffffff01;
  }
  __stack_chk_fail();
}

Assistant:

bool QFSFileEngine::remove()
{
    Q_D(QFSFileEngine);
    QSystemError error;
    bool ret = QFileSystemEngine::removeFile(d->fileEntry, error);
    if (!ret)
        setError(QFile::RemoveError, error.toString());
    else
        d->metaData.clear();
    return ret;
}